

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkTSDA.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkTSDA::IntLoadResidual_F(ChLinkTSDA *this,uint off,ChVectorDynamic<> *R,double c)

{
  double *pdVar1;
  int iVar2;
  Index size;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar3;
  double *pdVar4;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined8 in_XMM0_Qb;
  undefined1 auVar12 [16];
  
  iVar2 = (*(this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])();
  if ((char)iVar2 == '\0') {
    return;
  }
  iVar2 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  if (*(char *)(CONCAT44(extraout_var,iVar2) + 0x2c) == '\0') {
    if ((this->m_Qforce).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows < 3) goto LAB_0059d8d0;
    pdVar1 = (this->m_Qforce).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    iVar2 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
              _vptr_ChFrame[0x10])();
    lVar3 = (long)*(int *)(CONCAT44(extraout_var_00,iVar2) + 0x30);
    if ((lVar3 < 0) ||
       ((R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -3 <
        lVar3)) goto LAB_0059d8d0;
    pdVar4 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data +
             lVar3;
    uVar5 = 3;
    if (((ulong)pdVar4 & 7) == 0) {
      uVar6 = -((uint)((ulong)pdVar4 >> 3) & 0x1fffffff) & 7;
      if ((ulong)uVar6 < 3) {
        uVar5 = (ulong)uVar6;
      }
      if (uVar6 != 0) goto LAB_0059d555;
      uVar5 = 0;
LAB_0059d578:
      do {
        pdVar4[uVar5] = c * pdVar1[uVar5] + pdVar4[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar5 != 3);
    }
    else {
LAB_0059d555:
      uVar7 = 0;
      do {
        pdVar4[uVar7] = c * pdVar1[uVar7] + pdVar4[uVar7];
        uVar7 = uVar7 + 1;
      } while (uVar5 != uVar7);
      if ((int)uVar5 != 3) goto LAB_0059d578;
    }
    if ((this->m_Qforce).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows < 6) goto LAB_0059d8d0;
    pdVar1 = (this->m_Qforce).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    iVar2 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
              _vptr_ChFrame[0x10])();
    iVar2 = *(int *)(CONCAT44(extraout_var_01,iVar2) + 0x30);
    if ((iVar2 < -3) ||
       (lVar3 = (long)(iVar2 + 3),
       (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -3 <
       lVar3)) goto LAB_0059d8d0;
    pdVar4 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data +
             lVar3;
    uVar5 = 3;
    if (((ulong)pdVar4 & 7) == 0) {
      uVar6 = -((uint)((ulong)pdVar4 >> 3) & 0x1fffffff) & 7;
      if ((ulong)uVar6 < 3) {
        uVar5 = (ulong)uVar6;
      }
      if (uVar6 != 0) goto LAB_0059d600;
      uVar5 = 0;
    }
    else {
LAB_0059d600:
      uVar7 = 0;
      do {
        pdVar4[uVar7] = c * pdVar1[uVar7 + 3] + pdVar4[uVar7];
        uVar7 = uVar7 + 1;
      } while (uVar5 != uVar7);
      if ((int)uVar5 == 3) goto LAB_0059d63e;
    }
    do {
      pdVar4[uVar5] = c * pdVar1[uVar5 + 3] + pdVar4[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar5 != 3);
  }
LAB_0059d63e:
  iVar2 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  if (*(char *)(CONCAT44(extraout_var_02,iVar2) + 0x2c) == '\0') {
    if ((this->m_Qforce).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows < 9) goto LAB_0059d8d0;
    pdVar1 = (this->m_Qforce).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    iVar2 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
              _vptr_ChFrame[0x10])();
    lVar3 = (long)*(int *)(CONCAT44(extraout_var_03,iVar2) + 0x30);
    if ((lVar3 < 0) ||
       ((R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -3 <
        lVar3)) goto LAB_0059d8d0;
    pdVar4 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data +
             lVar3;
    uVar5 = 3;
    if (((ulong)pdVar4 & 7) == 0) {
      uVar6 = -((uint)((ulong)pdVar4 >> 3) & 0x1fffffff) & 7;
      if ((ulong)uVar6 < 3) {
        uVar5 = (ulong)uVar6;
      }
      if (uVar6 != 0) goto LAB_0059d6cb;
      uVar5 = 0;
LAB_0059d6ef:
      do {
        pdVar4[uVar5] = c * pdVar1[uVar5 + 6] + pdVar4[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar5 != 3);
    }
    else {
LAB_0059d6cb:
      uVar7 = 0;
      do {
        pdVar4[uVar7] = c * pdVar1[uVar7 + 6] + pdVar4[uVar7];
        uVar7 = uVar7 + 1;
      } while (uVar5 != uVar7);
      if ((int)uVar5 != 3) goto LAB_0059d6ef;
    }
    if ((this->m_Qforce).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows < 0xc) goto LAB_0059d8d0;
    pdVar1 = (this->m_Qforce).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    iVar2 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
              _vptr_ChFrame[0x10])();
    iVar2 = *(int *)(CONCAT44(extraout_var_04,iVar2) + 0x30);
    if ((iVar2 < -3) ||
       (lVar3 = (long)(iVar2 + 3),
       (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -3 <
       lVar3)) goto LAB_0059d8d0;
    pdVar4 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data +
             lVar3;
    uVar5 = 3;
    if (((ulong)pdVar4 & 7) == 0) {
      uVar6 = -((uint)((ulong)pdVar4 >> 3) & 0x1fffffff) & 7;
      if ((ulong)uVar6 < 3) {
        uVar5 = (ulong)uVar6;
      }
      if (uVar6 != 0) goto LAB_0059d77b;
      uVar5 = 0;
    }
    else {
LAB_0059d77b:
      uVar7 = 0;
      do {
        pdVar4[uVar7] = c * pdVar1[uVar7 + 9] + pdVar4[uVar7];
        uVar7 = uVar7 + 1;
      } while (uVar5 != uVar7);
      if ((int)uVar5 == 3) goto LAB_0059d7b9;
    }
    do {
      pdVar4[uVar5] = c * pdVar1[uVar5 + 9] + pdVar4[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar5 != 3);
  }
LAB_0059d7b9:
  auVar12._8_8_ = in_XMM0_Qb;
  auVar12._0_8_ = c;
  if (this->m_variables != (ChVariablesGenericDiagonalMass *)0x0) {
    uVar5 = (ulong)this->m_nstates;
    pdVar1 = (this->m_Qforce).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    if (pdVar1 != (double *)0x0 && (long)uVar5 < 0) {
      __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                    ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                    "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, Level = 0]"
                   );
    }
    if (((this->m_nstates < 0) ||
        ((long)((this->m_Qforce).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows - uVar5) < 0xc)) ||
       ((long)((R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
              - uVar5) < (long)(ulong)off)) {
LAB_0059d8d0:
      __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                    ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                    "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                   );
    }
    pdVar4 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data +
             off;
    uVar7 = uVar5;
    if ((((ulong)pdVar4 & 7) == 0) &&
       (uVar7 = (ulong)(-((uint)((ulong)pdVar4 >> 3) & 0x1fffffff) & 7), uVar5 <= uVar7)) {
      uVar7 = uVar5;
    }
    iVar2 = (int)(uVar5 - uVar7);
    iVar8 = iVar2 + 7;
    if (-1 < iVar2) {
      iVar8 = iVar2;
    }
    if (uVar7 != 0) {
      uVar9 = 0;
      do {
        pdVar4[uVar9] = c * pdVar1[uVar9 + 0xc] + pdVar4[uVar9];
        uVar9 = uVar9 + 1;
      } while (uVar7 != uVar9);
    }
    uVar9 = uVar7 + (long)(iVar8 >> 3) * 8;
    if (7 < (long)(uVar5 - uVar7)) {
      auVar10 = vbroadcastsd_avx512f(auVar12);
      do {
        auVar11 = vmulpd_avx512f(auVar10,*(undefined1 (*) [64])(pdVar1 + uVar7 + 0xc));
        auVar11 = vaddpd_avx512f(auVar11,*(undefined1 (*) [64])(pdVar4 + uVar7));
        *(undefined1 (*) [64])(pdVar4 + uVar7) = auVar11;
        uVar7 = uVar7 + 8;
      } while ((long)uVar7 < (long)uVar9);
    }
    if ((long)uVar9 < (long)uVar5) {
      do {
        pdVar4[uVar9] = c * pdVar1[uVar9 + 0xc] + pdVar4[uVar9];
        uVar9 = uVar9 + 1;
      } while (uVar5 != uVar9);
    }
  }
  return;
}

Assistant:

void ChLinkTSDA::IntLoadResidual_F(const unsigned int off,  // offset in R residual
                                   ChVectorDynamic<>& R,    // result: the R residual, R += c*F
                                   const double c           // a scaling factor
) {
    if (!IsActive())
        return;

    // Add forces to connected bodies (from the current vector of forcing terms)
    if (Body1->Variables().IsActive()) {
        R.segment(Body1->Variables().GetOffset() + 0, 3) += c * m_Qforce.segment(0, 3);
        R.segment(Body1->Variables().GetOffset() + 3, 3) += c * m_Qforce.segment(3, 3);
    }
    if (Body2->Variables().IsActive()) {
        R.segment(Body2->Variables().GetOffset() + 0, 3) += c * m_Qforce.segment(6, 3);
        R.segment(Body2->Variables().GetOffset() + 3, 3) += c * m_Qforce.segment(9, 3);
    }

    // Add forcing term for internal variables
    if (m_variables) {
        R.segment(off, m_nstates) += c * m_Qforce.segment(12, m_nstates);
    }
}